

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int parsePseudoAttribute
              (ENCODING *enc,char *ptr,char *end,char **namePtr,char **nameEndPtr,char **valPtr,
              char **nextTokPtr)

{
  int iVar1;
  int iVar2;
  int local_44;
  char open;
  int c;
  char **valPtr_local;
  char **nameEndPtr_local;
  char **namePtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (ptr == end) {
    *namePtr = (char *)0x0;
    enc_local._4_4_ = 1;
  }
  else {
    iVar1 = toAscii(enc,ptr,end);
    iVar1 = isSpace(iVar1);
    end_local = ptr;
    if (iVar1 == 0) {
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0;
    }
    else {
      do {
        end_local = end_local + enc->minBytesPerChar;
        iVar1 = toAscii(enc,end_local,end);
        iVar1 = isSpace(iVar1);
      } while (iVar1 != 0);
      if (end_local != end) {
        *namePtr = end_local;
        while( true ) {
          iVar1 = toAscii(enc,end_local,end);
          if (iVar1 == -1) {
            *nextTokPtr = end_local;
            return 0;
          }
          if (iVar1 == 0x3d) break;
          iVar1 = isSpace(iVar1);
          if (iVar1 != 0) {
            *nameEndPtr = end_local;
            do {
              end_local = end_local + enc->minBytesPerChar;
              iVar1 = toAscii(enc,end_local,end);
              iVar2 = isSpace(iVar1);
            } while (iVar2 != 0);
            if (iVar1 != 0x3d) {
              *nextTokPtr = end_local;
              return 0;
            }
LAB_00b1faf6:
            if (end_local == *namePtr) {
              *nextTokPtr = end_local;
              return 0;
            }
            end_local = end_local + enc->minBytesPerChar;
            local_44 = toAscii(enc,end_local,end);
            while (iVar1 = isSpace(local_44), iVar1 != 0) {
              end_local = end_local + enc->minBytesPerChar;
              local_44 = toAscii(enc,end_local,end);
            }
            if ((local_44 != 0x22) && (local_44 != 0x27)) {
              *nextTokPtr = end_local;
              return 0;
            }
            end_local = end_local + enc->minBytesPerChar;
            *valPtr = end_local;
            while( true ) {
              iVar1 = toAscii(enc,end_local,end);
              if (iVar1 == (char)local_44) {
                *nextTokPtr = end_local + enc->minBytesPerChar;
                return 1;
              }
              if ((((iVar1 < 0x61) || (0x7a < iVar1)) && ((iVar1 < 0x41 || (0x5a < iVar1)))) &&
                 ((((iVar1 < 0x30 || (0x39 < iVar1)) && (iVar1 != 0x2e)) &&
                  ((iVar1 != 0x2d && (iVar1 != 0x5f)))))) break;
              end_local = end_local + enc->minBytesPerChar;
            }
            *nextTokPtr = end_local;
            return 0;
          }
          end_local = end_local + enc->minBytesPerChar;
        }
        *nameEndPtr = end_local;
        goto LAB_00b1faf6;
      }
      *namePtr = (char *)0x0;
      enc_local._4_4_ = 1;
    }
  }
  return enc_local._4_4_;
}

Assistant:

static int
parsePseudoAttribute(const ENCODING *enc, const char *ptr, const char *end,
                     const char **namePtr, const char **nameEndPtr,
                     const char **valPtr, const char **nextTokPtr) {
  int c;
  char open;
  if (ptr == end) {
    *namePtr = NULL;
    return 1;
  }
  if (! isSpace(toAscii(enc, ptr, end))) {
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    ptr += enc->minBytesPerChar;
  } while (isSpace(toAscii(enc, ptr, end)));
  if (ptr == end) {
    *namePtr = NULL;
    return 1;
  }
  *namePtr = ptr;
  for (;;) {
    c = toAscii(enc, ptr, end);
    if (c == -1) {
      *nextTokPtr = ptr;
      return 0;
    }
    if (c == ASCII_EQUALS) {
      *nameEndPtr = ptr;
      break;
    }
    if (isSpace(c)) {
      *nameEndPtr = ptr;
      do {
        ptr += enc->minBytesPerChar;
      } while (isSpace(c = toAscii(enc, ptr, end)));
      if (c != ASCII_EQUALS) {
        *nextTokPtr = ptr;
        return 0;
      }
      break;
    }
    ptr += enc->minBytesPerChar;
  }
  if (ptr == *namePtr) {
    *nextTokPtr = ptr;
    return 0;
  }
  ptr += enc->minBytesPerChar;
  c = toAscii(enc, ptr, end);
  while (isSpace(c)) {
    ptr += enc->minBytesPerChar;
    c = toAscii(enc, ptr, end);
  }
  if (c != ASCII_QUOT && c != ASCII_APOS) {
    *nextTokPtr = ptr;
    return 0;
  }
  open = (char)c;
  ptr += enc->minBytesPerChar;
  *valPtr = ptr;
  for (;; ptr += enc->minBytesPerChar) {
    c = toAscii(enc, ptr, end);
    if (c == open)
      break;
    if (! (ASCII_a <= c && c <= ASCII_z) && ! (ASCII_A <= c && c <= ASCII_Z)
        && ! (ASCII_0 <= c && c <= ASCII_9) && c != ASCII_PERIOD
        && c != ASCII_MINUS && c != ASCII_UNDERSCORE) {
      *nextTokPtr = ptr;
      return 0;
    }
  }
  *nextTokPtr = ptr + enc->minBytesPerChar;
  return 1;
}